

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDEdgeSharpness::EqualTrend(ON_SubDEdgeSharpness s0,ON_SubDEdgeSharpness s1)

{
  int iVar1;
  int iVar2;
  ON_SubDEdgeSharpness local_1c;
  ON_SubDEdgeSharpness s1_local;
  ON_SubDEdgeSharpness s0_local;
  
  s1_local.m_edge_sharpness[1] = s0.m_edge_sharpness[1];
  local_1c.m_edge_sharpness[0] = s1.m_edge_sharpness[0];
  if (s1_local.m_edge_sharpness[1] == local_1c.m_edge_sharpness[0]) {
    local_1c.m_edge_sharpness = s1.m_edge_sharpness;
    s1_local = s0;
    iVar1 = Trend(&s1_local);
    iVar2 = Trend(&local_1c);
    s0_local.m_edge_sharpness[0]._3_1_ = iVar1 == iVar2;
  }
  else {
    s0_local.m_edge_sharpness[0]._3_1_ = false;
  }
  return s0_local.m_edge_sharpness[0]._3_1_;
}

Assistant:

bool ON_SubDEdgeSharpness::EqualTrend(
  ON_SubDEdgeSharpness s0,
  ON_SubDEdgeSharpness s1
)
{
  if (false == (s0.m_edge_sharpness[1] == s1.m_edge_sharpness[0]))
    return false;
  return (s0.Trend() == s1.Trend());
}